

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

CheckedError __thiscall flatbuffers::Parser::ParseHexNum(Parser *this,int nibbles,uint64_t *val)

{
  size_type sVar1;
  ulong uVar2;
  int *piVar3;
  ulonglong uVar4;
  undefined8 *puVar5;
  long *plVar6;
  ulonglong *in_RCX;
  size_type *psVar7;
  ulong uVar8;
  undefined4 in_register_00000034;
  string *msg;
  string target;
  char *endptr;
  size_type *local_98;
  long local_90;
  size_type local_88;
  long lStack_80;
  ulonglong *local_78;
  size_type *local_70;
  undefined8 local_68;
  size_type local_60;
  undefined8 uStack_58;
  string local_50;
  
  msg = (string *)CONCAT44(in_register_00000034,nibbles);
  if ((int)val < 1) {
    __assert_fail("nibbles > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_parser.cpp"
                  ,0x1c8,"CheckedError flatbuffers::Parser::ParseHexNum(int, uint64_t *)");
  }
  sVar1 = msg->_M_string_length;
  uVar8 = (ulong)val & 0xffffffff;
  uVar2 = 0;
  while (((int)*(char *)(sVar1 + uVar2) - 0x30U < 10 ||
         (((int)*(char *)(sVar1 + uVar2) & 0xffffffdfU) - 0x41 < 6))) {
    uVar2 = uVar2 + 1;
    if (uVar8 == uVar2) {
      local_98 = &local_88;
      local_78 = in_RCX;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,sVar1,sVar1 + uVar8);
      psVar7 = local_98;
      if (local_98 == (size_type *)0x0) {
        __assert_fail("str",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/util.h"
                      ,0x11f,
                      "bool flatbuffers::StringToIntegerImpl(T *, const char *const, const int, const bool) [T = unsigned long]"
                     );
      }
      piVar3 = __errno_location();
      *piVar3 = 0;
      local_70 = psVar7;
      uVar4 = strtoull_l((char *)psVar7,(char **)&local_70,0x10,ClassicLocale::instance_);
      if (((local_70 == psVar7) || ((char)*local_70 != '\0')) || (*piVar3 != 0)) {
        uVar4 = 0;
      }
      *local_78 = uVar4;
      msg->_M_string_length = msg->_M_string_length + uVar8;
      *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
      local_50.field_2._M_allocated_capacity = local_88;
      local_50._M_dataplus._M_p = (pointer)local_98;
      if (local_98 != &local_88) {
LAB_00115ff4:
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
LAB_00115ffc:
      return SUB82(this,0);
    }
  }
  NumToString<int>(&local_50,(int)val);
  puVar5 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x357617);
  psVar7 = puVar5 + 2;
  if ((size_type *)*puVar5 == psVar7) {
    local_60 = *psVar7;
    uStack_58 = puVar5[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *psVar7;
    local_70 = (size_type *)*puVar5;
  }
  local_68 = puVar5[1];
  *puVar5 = psVar7;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
  psVar7 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar7) {
    local_88 = *psVar7;
    lStack_80 = plVar6[3];
    local_98 = &local_88;
  }
  else {
    local_88 = *psVar7;
    local_98 = (size_type *)*plVar6;
  }
  local_90 = plVar6[1];
  *plVar6 = (long)psVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  Error(this,msg);
  if (local_98 != &local_88) {
    operator_delete(local_98,local_88 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) goto LAB_00115ff4;
  goto LAB_00115ffc;
}

Assistant:

CheckedError Parser::ParseHexNum(int nibbles, uint64_t *val) {
  FLATBUFFERS_ASSERT(nibbles > 0);
  for (int i = 0; i < nibbles; i++)
    if (!is_xdigit(cursor_[i]))
      return Error("escape code must be followed by " + NumToString(nibbles) +
                   " hex digits");
  std::string target(cursor_, cursor_ + nibbles);
  *val = StringToUInt(target.c_str(), 16);
  cursor_ += nibbles;
  return NoError();
}